

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int ref_mv_idx_to_search
              (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,HandleInterModeArgs *args,
              int64_t ref_best_rd,BLOCK_SIZE bsize,int ref_set)

{
  MB_MODE_INFO *mbmi_00;
  _Bool _Var1;
  int64_t iVar2;
  long in_RSI;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  int in_stack_00000008;
  int64_t in_stack_00000010;
  int i_2;
  int result;
  double ref_dth;
  double dth;
  MACROBLOCK *in_stack_00000030;
  int i_1;
  int best_idx;
  int ref_mv_idx;
  int64_t idx_rdcost [3];
  int i;
  int good_indices;
  PREDICTION_MODE this_mode;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff4f;
  AV1_COMMON *in_stack_ffffffffffffff50;
  double local_a8;
  int local_a0;
  int local_9c [3];
  double local_90;
  int local_84;
  int local_80;
  int in_stack_ffffffffffffff84;
  int64_t in_stack_ffffffffffffff88;
  HandleInterModeArgs *in_stack_ffffffffffffff90;
  MACROBLOCK *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined3 in_stack_ffffffffffffffac;
  undefined4 uVar4;
  int local_4;
  
  if (in_stack_00000008 == 1) {
    local_4 = 1;
  }
  else {
    mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
    uVar4 = CONCAT13(mbmi_00->mode,in_stack_ffffffffffffffac);
    local_4 = 0;
    for (iVar3 = 0; iVar3 < in_stack_00000008; iVar3 = iVar3 + 1) {
      _Var1 = ref_mv_idx_early_breakout
                        ((SPEED_FEATURES *)CONCAT44(uVar4,local_4),
                         (RefFrameDistanceInfo *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      if (!_Var1) {
        mask_set_bit((int *)&stack0xffffffffffffffa8,iVar3);
      }
    }
    if (((*(int *)(in_RDI + 0x60ac0) != 0) &&
        (iVar3 = have_nearmv_in_inter_mode((PREDICTION_MODE)((uint)uVar4 >> 0x18)), iVar3 != 0)) &&
       (6 < "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_R9B])) {
      get_ref_scale_factors(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
      iVar3 = av1_is_scaled((scale_factors *)in_stack_ffffffffffffff50);
      if (iVar3 == 0) {
        if ('\0' < mbmi_00->ref_frame[1]) {
          get_ref_scale_factors(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
          iVar3 = av1_is_scaled((scale_factors *)in_stack_ffffffffffffff50);
          if (iVar3 != 0) {
            return local_4;
          }
        }
        for (iVar3 = 0; iVar3 < in_stack_00000008; iVar3 = iVar3 + 1) {
          _Var1 = mask_check_bit(local_4,iVar3);
          if (_Var1) {
            iVar2 = simple_translation_pred_rd
                              (_best_idx,in_stack_00000030,(RD_STATS *)dth,
                               (HandleInterModeArgs *)ref_dth,result,in_stack_00000010,
                               (BLOCK_SIZE)idx_rdcost[2]);
            *(int64_t *)(&stack0xffffffffffffff88 + (long)iVar3 * 8) = iVar2;
          }
        }
        local_80 = 0;
        for (local_84 = 1; local_84 < 3; local_84 = local_84 + 1) {
          if (*(long *)(&stack0xffffffffffffff88 + (long)local_84 * 8) <
              *(long *)(&stack0xffffffffffffff88 + (long)local_80 * 8)) {
            local_80 = local_84;
          }
        }
        iVar3 = has_second_ref(mbmi_00);
        local_a8 = 1.05;
        if (iVar3 == 0) {
          local_a8 = 1.001;
        }
        local_90 = local_a8;
        local_9c[1] = 0;
        local_9c[2] = 0x40140000;
        local_9c[0] = 0;
        for (local_a0 = 0; local_a0 < in_stack_00000008; local_a0 = local_a0 + 1) {
          _Var1 = mask_check_bit(local_4,local_a0);
          if (((_Var1) &&
              (((double)*(long *)(&stack0xffffffffffffff88 + (long)local_a0 * 8) * 1.0) /
               (double)*(long *)(&stack0xffffffffffffff88 + (long)local_80 * 8) < local_90)) &&
             (((double)*(long *)(&stack0xffffffffffffff88 + (long)local_a0 * 8) * 1.0) /
              (double)in_R8 < 5.0)) {
            mask_set_bit(local_9c,local_a0);
          }
        }
        local_4 = local_9c[0];
      }
    }
  }
  return local_4;
}

Assistant:

static int ref_mv_idx_to_search(AV1_COMP *const cpi, MACROBLOCK *x,
                                RD_STATS *rd_stats,
                                HandleInterModeArgs *const args,
                                int64_t ref_best_rd, BLOCK_SIZE bsize,
                                const int ref_set) {
  // If the number of ref mv count is equal to 1, do not prune the same. It
  // is better to evaluate the same than to prune it.
  if (ref_set == 1) return 1;
  AV1_COMMON *const cm = &cpi->common;
  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const PREDICTION_MODE this_mode = mbmi->mode;

  // Only search indices if they have some chance of being good.
  int good_indices = 0;
  for (int i = 0; i < ref_set; ++i) {
    if (ref_mv_idx_early_breakout(&cpi->sf, &cpi->ref_frame_dist_info, x, args,
                                  ref_best_rd, i)) {
      continue;
    }
    mask_set_bit(&good_indices, i);
  }

  // Only prune in NEARMV mode, if the speed feature is set, and the block size
  // is large enough. If these conditions are not met, return all good indices
  // found so far.
  if (!cpi->sf.inter_sf.prune_mode_search_simple_translation)
    return good_indices;
  if (!have_nearmv_in_inter_mode(this_mode)) return good_indices;
  if (num_pels_log2_lookup[bsize] <= 6) return good_indices;
  // Do not prune when there is internal resizing. TODO(elliottk) fix this
  // so b/2384 can be resolved.
  if (av1_is_scaled(get_ref_scale_factors(cm, mbmi->ref_frame[0])) ||
      (mbmi->ref_frame[1] > 0 &&
       av1_is_scaled(get_ref_scale_factors(cm, mbmi->ref_frame[1])))) {
    return good_indices;
  }

  // Calculate the RD cost for the motion vectors using simple translation.
  int64_t idx_rdcost[] = { INT64_MAX, INT64_MAX, INT64_MAX };
  for (int ref_mv_idx = 0; ref_mv_idx < ref_set; ++ref_mv_idx) {
    // If this index is bad, ignore it.
    if (!mask_check_bit(good_indices, ref_mv_idx)) {
      continue;
    }
    idx_rdcost[ref_mv_idx] = simple_translation_pred_rd(
        cpi, x, rd_stats, args, ref_mv_idx, ref_best_rd, bsize);
  }
  // Find the index with the best RD cost.
  int best_idx = 0;
  for (int i = 1; i < MAX_REF_MV_SEARCH; ++i) {
    if (idx_rdcost[i] < idx_rdcost[best_idx]) {
      best_idx = i;
    }
  }
  // Only include indices that are good and within a % of the best.
  const double dth = has_second_ref(mbmi) ? 1.05 : 1.001;
  // If the simple translation cost is not within this multiple of the
  // best RD, skip it. Note that the cutoff is derived experimentally.
  const double ref_dth = 5;
  int result = 0;
  for (int i = 0; i < ref_set; ++i) {
    if (mask_check_bit(good_indices, i) &&
        (1.0 * idx_rdcost[i]) / idx_rdcost[best_idx] < dth &&
        (1.0 * idx_rdcost[i]) / ref_best_rd < ref_dth) {
      mask_set_bit(&result, i);
    }
  }
  return result;
}